

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

qpdf_oh qpdf_oh_new_real_from_double(qpdf_data qpdf,double value,int decimal_places)

{
  double qpdf_00;
  qpdf_oh qVar1;
  QPDFObjectHandle local_30;
  int local_1c;
  double dStack_18;
  int decimal_places_local;
  double value_local;
  qpdf_data qpdf_local;
  
  local_1c = decimal_places;
  dStack_18 = value;
  value_local = (double)qpdf;
  QTC::TC("qpdf","qpdf-c called qpdf_oh_new_real_from_double",0);
  qpdf_00 = value_local;
  QPDFObjectHandle::newReal(&local_30,dStack_18,local_1c,true);
  qVar1 = new_object((qpdf_data)qpdf_00,&local_30);
  QPDFObjectHandle::~QPDFObjectHandle(&local_30);
  return qVar1;
}

Assistant:

qpdf_oh
qpdf_oh_new_real_from_double(qpdf_data qpdf, double value, int decimal_places)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_oh_new_real_from_double");
    return new_object(qpdf, QPDFObjectHandle::newReal(value, decimal_places));
}